

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionMenuItem::QStyleOptionMenuItem(QStyleOptionMenuItem *this,int version)

{
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  QStyleOption::QStyleOption
            ((QStyleOption *)CONCAT44(version,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x49) = 1;
  QRect::QRect((QRect *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QString::QString((QString *)0x41d2f8);
  QIcon::QIcon((QIcon *)(in_RDI + 0x78));
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  QFont::QFont((QFont *)(in_RDI + 0x88));
  return;
}

Assistant:

QStyleOptionMenuItem::QStyleOptionMenuItem(int version)
    : QStyleOption(version, SO_MenuItem), menuItemType(Normal),
      checkType(NotCheckable), checked(false), menuHasCheckableItems(true), maxIconWidth(0),
      reservedShortcutWidth(0)
{
}